

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O1

X509 * X509_new(void)

{
  X509 *a;
  X509_CINF *pXVar1;
  X509_ALGOR *pXVar2;
  ASN1_BIT_STRING *pAVar3;
  
  a = (X509 *)x509_new_null();
  if (a != (X509 *)0x0) {
    pXVar1 = (X509_CINF *)ASN1_item_new((ASN1_ITEM *)&X509_CINF_it);
    a->cert_info = pXVar1;
    pXVar2 = X509_ALGOR_new();
    a->sig_alg = pXVar2;
    pAVar3 = ASN1_BIT_STRING_new();
    a->signature = pAVar3;
    if ((a->cert_info != (X509_CINF *)0x0) &&
       (pAVar3 != (ASN1_BIT_STRING *)0x0 && a->sig_alg != (X509_ALGOR *)0x0)) {
      return a;
    }
    X509_free(a);
  }
  return (X509 *)0x0;
}

Assistant:

X509 *X509_new(void) {
  X509 *ret = x509_new_null();
  if (ret == NULL) {
    return NULL;
  }

  ret->cert_info = X509_CINF_new();
  ret->sig_alg = X509_ALGOR_new();
  ret->signature = ASN1_BIT_STRING_new();
  if (ret->cert_info == NULL || ret->sig_alg == NULL ||
      ret->signature == NULL) {
    X509_free(ret);
    return NULL;
  }

  return ret;
}